

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O0

void P_CheckWeaponButtons(player_t *player)

{
  size_t sVar1;
  bool bVar2;
  FName local_2c;
  FState *local_28;
  FState *state;
  size_t i;
  AWeapon *weapon;
  player_t *player_local;
  
  weapon = (AWeapon *)player;
  bVar2 = TObjPtr<DBot>::operator==(&player->Bot,(DBot *)0x0);
  if (((!bVar2) || (bVar2 = FBoolCVar::operator_cast_to_bool(&bot_observer), !bVar2)) &&
     (i._0_2_ = (weapon->super_AInventory).super_AActor.sprite,
     i._2_1_ = (weapon->super_AInventory).super_AActor.frame,
     i._3_5_ = *(undefined5 *)&(weapon->super_AInventory).super_AActor.field_0xd3, i != 0)) {
    for (state = (FState *)0x0; sVar1 = i, state < (FState *)0x6;
        state = (FState *)((long)&state->NextState + 1)) {
      if ((((uint)*(ushort *)((long)&(weapon->super_AInventory).super_AActor.FloatSpeed + 6) &
           ButtonChecks[(long)state].StateFlag) != 0) &&
         ((*(uint *)((long)&(weapon->super_AInventory).super_AActor.super_DThinker.super_DObject.
                            Class + 4) & ButtonChecks[(long)state].ButtonFlag) != 0)) {
        FName::FName(&local_2c,ButtonChecks[(long)state].StateName);
        local_28 = (FState *)(**(code **)(*(long *)sVar1 + 0x248))(sVar1,&local_2c);
        if (local_28 != (FState *)0x0) {
          P_SetPsprite((player_t *)weapon,PSP_WEAPON,local_28,false);
          return;
        }
        local_28 = (FState *)0x0;
      }
    }
  }
  return;
}

Assistant:

static void P_CheckWeaponButtons (player_t *player)
{
	if (player->Bot == nullptr && bot_observer)
	{
		return;
	}
	AWeapon *weapon = player->ReadyWeapon;
	if (weapon == nullptr)
	{
		return;
	}
	// The button checks are ordered by precedence. The first one to match a
	// button press and affect a state change wins.
	for (size_t i = 0; i < countof(ButtonChecks); ++i)
	{
		if ((player->WeaponState & ButtonChecks[i].StateFlag) &&
			(player->cmd.ucmd.buttons & ButtonChecks[i].ButtonFlag))
		{
			FState *state = weapon->GetStateForButtonName(ButtonChecks[i].StateName);
			// [XA] don't change state if still null, so if the modder
			// sets WRF_xxx to true but forgets to define the corresponding
			// state, the weapon won't disappear. ;)
			if (state != nullptr)
			{
				P_SetPsprite(player, PSP_WEAPON, state);
				return;
			}
		}
	}
}